

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O0

void mp::WriteVar<fmt::BasicMemoryWriter<char,std::allocator<char>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *pr,char *name,double lb,double ub,
               Type ty)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  BasicStringRef<char> value_02;
  BasicStringRef<char> value_03;
  BasicStringRef<char> value_04;
  BasicStringRef<char> value_05;
  BasicWriter<char> *pBVar1;
  int in_EDX;
  BasicWriter<char> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  char *in_stack_ffffffffffffff28;
  BasicStringRef<char> *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff48;
  BasicWriter<char> *in_stack_ffffffffffffff50;
  BasicWriter<char> *pBVar2;
  size_t in_stack_ffffffffffffff60;
  
  pBVar2 = in_RDI;
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  value.size_ = in_stack_ffffffffffffff60;
  value.data_ = (char *)pBVar2;
  pBVar1 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  value_00.size_ = (size_t)pBVar1;
  value_00.data_ = (char *)pBVar2;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_00);
  if ((((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 1.0)) ||
     ((NAN(in_XMM1_Qa) || (in_EDX != 1)))) {
    if ((in_XMM0_Qa != in_XMM1_Qa) || (NAN(in_XMM0_Qa) || NAN(in_XMM1_Qa))) {
      if (-1.79769313486232e+308 < in_XMM0_Qa) {
        fmt::BasicStringRef<char>::BasicStringRef
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        value_03.size_ = (size_t)pBVar1;
        value_03.data_ = (char *)pBVar2;
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_03);
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      if (in_XMM1_Qa < 1.79769313486232e+308) {
        fmt::BasicStringRef<char>::BasicStringRef
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        value_04.size_ = (size_t)pBVar1;
        value_04.data_ = (char *)pBVar2;
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_04);
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      }
      if (in_EDX == 1) {
        fmt::BasicStringRef<char>::BasicStringRef
                  ((BasicStringRef<char> *)in_RDI,in_stack_ffffffffffffff28);
        value_05.size_ = (size_t)pBVar1;
        value_05.data_ = (char *)pBVar2;
        fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_05);
      }
    }
    else {
      fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
      ;
      value_02.size_ = (size_t)pBVar1;
      value_02.data_ = (char *)pBVar2;
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,value_02);
      fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffff50,(double)in_RDI);
    }
  }
  else {
    fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    value_01.size_ = (size_t)pBVar1;
    value_01.data_ = (char *)pBVar2;
    fmt::BasicWriter<char>::operator<<(in_RDI,value_01);
  }
  return;
}

Assistant:

void WriteVar(Writer& pr, const char* name,
              double lb, double ub, var::Type ty) {
  assert(*name);
  pr << "var " << name;
  if (!lb && 1.0==ub && var::INTEGER==ty)
    pr << " binary";
  else if (lb==ub)
    pr << " = " << lb;
  else {
    if (lb > -DBL_MAX)
    pr << " >=" << lb;
    if (ub < DBL_MAX)
    pr << " <=" << ub;
    if (var::INTEGER == ty)
    pr << " integer";
  }
}